

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  char **ppcVar3;
  int iVar4;
  array<int,_2UL> p;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Allocator AVar10;
  FILE *__stream;
  _Any_data *onError;
  int c;
  int iVar11;
  char *pcVar12;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  Point2i p_00;
  int c_1;
  int iVar13;
  long lVar14;
  Float FVar15;
  undefined1 auVar16 [64];
  span<int> out;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  allocator<char> local_4a1;
  float local_4a0;
  int width;
  int nInstances;
  allocator<char> local_492;
  allocator<char> local_491;
  char **argv_local;
  array<int,_2UL> pixel;
  int vb;
  undefined1 local_478 [12];
  Float sigma;
  WrapMode2D local_468;
  WrapMode2D local_460;
  string filename;
  _Any_data local_438;
  code *local_428;
  code *local_420;
  RNG rng;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *local_3c0;
  ImageChannelDesc rgbDesc;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  ColorEncodingHandle local_368;
  Image image;
  ImageAndMetadata imRead;
  undefined1 extraout_var [60];
  
  imRead.image.channelNames.field_2.fixed[0]._M_string_length =
       (long)&imRead.image.channelNames.field_2 + 0x18;
  imRead.image.channelNames.field_2.fixed[1]._M_string_length =
       (long)&imRead.image.channelNames.field_2 + 0x38;
  imRead.image.channelNames.field_2.fixed[2]._M_string_length =
       (long)&imRead.image.channelNames.field_2 + 0x58;
  imRead.image.format = U256;
  imRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  imRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  imRead.image._12_4_ = 0;
  imRead.image.channelNames.alloc.memoryResource = (memory_resource *)0x100000001;
  imRead.image.channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  imRead.image.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  imRead.image.channelNames.field_2._16_8_ = 0;
  imRead.image.channelNames.field_2._24_1_ = 0;
  imRead.image.channelNames.field_2._48_8_ = 0;
  imRead.image.channelNames.field_2._56_1_ = 0;
  imRead.image.channelNames.field_2._80_8_ = 0;
  imRead.image.channelNames.field_2._88_1_ = 0;
  imRead.image.channelNames.field_2.fixed[3]._M_string_length =
       (long)&imRead.image.channelNames.field_2 + 0x78;
  imRead.image.channelNames.nStored = (size_t)&imRead.image.p8;
  imRead.image.channelNames.field_2._112_8_ = 0;
  imRead.image.channelNames.field_2._120_1_ = 0;
  imRead.image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  imRead.image.p8.alloc.memoryResource._0_1_ = 0;
  imRead.image.p16.nAlloc = 0;
  imRead.image._200_32_ = ZEXT432(0) << 0x40;
  argv_local = argv;
  pbrt::InitPBRT((PBRTOptions *)&imRead);
  pbrt::PBRTOptions::~PBRTOptions((PBRTOptions *)&imRead);
  ppcVar3 = argv_local;
  if (argc < 2) {
    help();
  }
  else {
    __s1 = argv_local[1];
    pcVar12 = __s1;
    iVar8 = strcmp(__s1,"average");
    if (iVar8 == 0) {
      iVar8 = average((int)pcVar12,ppcVar3 + 2);
      return iVar8;
    }
    iVar8 = strcmp(__s1,"assemble");
    if (iVar8 == 0) {
      assemble(argc + -2,ppcVar3 + 2);
    }
    else {
      pcVar12 = __s1;
      iVar8 = strcmp(__s1,"bloom");
      if (iVar8 == 0) {
        iVar8 = bloom((int)pcVar12,ppcVar3 + 2);
        return iVar8;
      }
      iVar8 = strcmp(__s1,"cat");
      if (iVar8 == 0) {
        iVar8 = cat(argc + -2,ppcVar3 + 2);
        return iVar8;
      }
      pcVar12 = __s1;
      iVar8 = strcmp(__s1,"convert");
      if (iVar8 == 0) {
        iVar8 = convert((int)pcVar12,ppcVar3 + 2);
        return iVar8;
      }
      pcVar12 = __s1;
      iVar8 = strcmp(__s1,"diff");
      if (iVar8 == 0) {
        iVar8 = diff((int)pcVar12,ppcVar3 + 2);
        return iVar8;
      }
      pcVar12 = __s1;
      iVar8 = strcmp(__s1,"denoise");
      if (iVar8 == 0) {
        iVar8 = denoise((int)pcVar12,ppcVar3 + 2);
        return iVar8;
      }
      pcVar12 = __s1;
      iVar8 = strcmp(__s1,"error");
      if (iVar8 == 0) {
        iVar8 = error((int)pcVar12,ppcVar3 + 2);
        return iVar8;
      }
      pcVar12 = __s1;
      iVar8 = strcmp(__s1,"falsecolor");
      if (iVar8 == 0) {
        iVar8 = falsecolor((int)pcVar12,ppcVar3 + 2);
        return iVar8;
      }
      iVar8 = strcmp(__s1,"help");
      if ((((iVar8 == 0) || (iVar8 = strcmp(__s1,"-help"), iVar8 == 0)) ||
          (iVar8 = strcmp(__s1,"--help"), iVar8 == 0)) ||
         (((*__s1 == '-' && (__s1[1] == 'h')) && (__s1[2] == '\0')))) {
        iVar8 = help(argc + -2,ppcVar3 + 2);
        return iVar8;
      }
      iVar8 = strcmp(__s1,"info");
      if (iVar8 == 0) {
        info(argc + -2,ppcVar3 + 2);
      }
      else {
        pcVar12 = __s1;
        iVar8 = strcmp(__s1,"makeenv");
        if (iVar8 == 0) {
          makeenv((int)pcVar12,ppcVar3 + 2);
        }
        else {
          pcVar12 = __s1;
          iVar8 = strcmp(__s1,"makeemitters");
          if (iVar8 == 0) {
            iVar8 = makeemitters((int)pcVar12,ppcVar3 + 2);
            return iVar8;
          }
          pcVar12 = __s1;
          iVar8 = strcmp(__s1,"makesky");
          if (iVar8 != 0) {
            pcVar12 = __s1;
            iVar8 = strcmp(__s1,"whitebalance");
            if (iVar8 == 0) {
              iVar8 = whitebalance((int)pcVar12,ppcVar3 + 2);
              return iVar8;
            }
            iVar8 = strcmp(__s1,"noisybit");
            if (iVar8 == 0) {
              filename._M_dataplus._M_p = (pointer)&filename.field_2;
              argv_local = ppcVar3 + 2;
              filename._M_string_length = 0;
              pixel._M_elems[0] = 0;
              pixel._M_elems[1] = 0;
              filename.field_2._M_local_buf[0] = '\0';
              width = 10;
              sigma = 1.0;
              nInstances = 100;
              while (*argv_local != (char *)0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&imRead,"pixel",(allocator<char> *)&vb);
                local_3d8._M_unused._M_object = (void *)0x0;
                local_3d8._8_8_ = 0;
                local_3c0 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                            ::_M_invoke;
                local_3c8 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                            ::_M_manager;
                out.n = (size_t)&local_3d8;
                out.ptr = (int *)0x2;
                bVar6 = pbrt::ParseArg<pstd::span<int>>
                                  ((pbrt *)&argv_local,(char ***)&imRead,(string *)&pixel,out,in_R9)
                ;
                if (bVar6) {
LAB_00264ff6:
                  std::_Function_base::~_Function_base((_Function_base *)&local_3d8);
                  std::__cxx11::string::~string((string *)&imRead);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&image,"width",&local_4a1);
                  local_438._M_unused._M_object = (void *)0x0;
                  local_438._8_8_ = 0;
                  local_420 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                              ::_M_invoke;
                  local_428 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                              ::_M_manager;
                  bVar6 = pbrt::ParseArg<int*>
                                    (&argv_local,(string *)&image,&width,
                                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)&local_438);
                  if (bVar6) {
                    std::_Function_base::~_Function_base((_Function_base *)&local_438);
                    std::__cxx11::string::~string((string *)&image);
                    goto LAB_00264ff6;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&rgbDesc,"sigma",&local_491);
                  local_3f8._M_unused._M_object = (void *)0x0;
                  local_3f8._8_8_ = 0;
                  local_3e0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                              ::_M_invoke;
                  local_3e8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                              ::_M_manager;
                  onError = &local_3f8;
                  bVar6 = pbrt::ParseArg<float*>
                                    (&argv_local,(string *)&rgbDesc,&sigma,
                                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)onError);
                  bVar7 = true;
                  if (!bVar6) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&rng,"n",&local_492);
                    local_388._M_unused._M_object = (void *)0x0;
                    local_388._8_8_ = 0;
                    local_370 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                                ::_M_invoke;
                    local_378 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2296:28)>
                                ::_M_manager;
                    onError = &local_388;
                    bVar7 = pbrt::ParseArg<int*>
                                      (&argv_local,(string *)&rng,&nInstances,
                                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        *)&local_388);
                    std::_Function_base::~_Function_base((_Function_base *)&local_388);
                    std::__cxx11::string::~string((string *)&rng);
                  }
                  std::_Function_base::~_Function_base((_Function_base *)&local_3f8);
                  std::__cxx11::string::~string((string *)&rgbDesc);
                  std::_Function_base::~_Function_base((_Function_base *)&local_438);
                  std::__cxx11::string::~string((string *)&image);
                  std::_Function_base::~_Function_base((_Function_base *)&local_3d8);
                  std::__cxx11::string::~string((string *)&imRead);
                  if (bVar7 == false) {
                    if (filename._M_string_length != 0) {
                      pbrt::StringPrintf<char*&>
                                ((string *)&imRead,(pbrt *)"unexpected argument \"%s\"",
                                 (char *)argv_local,(char **)onError);
                      usage("%s",(char *)imRead.image._0_8_);
                    }
                    std::__cxx11::string::assign((char *)&filename);
                    argv_local = argv_local + 1;
                  }
                }
              }
              if (filename._M_string_length == 0) {
                pbrt::LogFatal<char_const(&)[18]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                           ,0x907,"Check failed: %s",(char (*) [18])"!filename.empty()");
              }
              AVar10.memoryResource = pstd::pmr::new_delete_resource();
              local_368.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                       )0;
              pbrt::Image::Read(&imRead,&filename,AVar10,&local_368);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&image,"R",(allocator<char> *)&rng);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)image.channelNames.field_2.fixed,"G",(allocator<char> *)&vb);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)(image.channelNames.field_2.fixed + 1),"B",&local_4a1);
              requestedChannels.n = 3;
              requestedChannels.ptr =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
              pbrt::Image::GetChannelDesc(&rgbDesc,&imRead.image,requestedChannels);
              lVar14 = 0x40;
              do {
                std::__cxx11::string::~string((string *)((long)&image.format + lVar14));
                lVar14 = lVar14 + -0x20;
              } while (lVar14 != -0x20);
              if (rgbDesc.offset.nStored == 0) {
                pbrt::LogFatal<char_const(&)[14]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                           ,0x90b,"Check failed: %s",(char (*) [14])"(bool)rgbDesc");
              }
              AVar10.memoryResource = pstd::pmr::new_delete_resource();
              pbrt::Image::SelectChannels(&image,&imRead.image,&rgbDesc,AVar10);
              if (((pixel._M_elems[0] < width) ||
                  (image.resolution.super_Tuple2<pbrt::Point2,_int>.x <= width + pixel._M_elems[0]))
                 || (image.resolution.super_Tuple2<pbrt::Point2,_int>.y <= width + pixel._M_elems[0]
                    )) {
                bVar6 = false;
                fprintf(_stderr,
                        "%s: pixel (%d, %d) with width %d doesn\'t work with resolution (%d, %d).\n"
                        ,filename._M_dataplus._M_p,(ulong)pixel._M_elems & 0xffffffff,
                        (ulong)pixel._M_elems & 0xffffffff,(ulong)(uint)width,
                        image.resolution.super_Tuple2<pbrt::Point2,_int>,
                        (ulong)image.resolution.super_Tuple2<pbrt::Point2,_int> >> 0x20);
              }
              else {
                iVar8 = width * 2 + 1;
                vb = iVar8 * iVar8;
                rng.state = CONCAT44(rng.state._4_4_,nInstances * 3);
                if (nInstances * 3 < vb) {
                  pbrt::
                  LogFatal<char_const(&)[15],char_const(&)[8],char_const(&)[15],int&,char_const(&)[8],int&>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                             ,0x919,"Check failed: %s >= %s with %s = %s, %s = %s",
                             (char (*) [15])"3 * nInstances",(char (*) [8])"nPixels",
                             (char (*) [15])"3 * nInstances",(int *)&rng,(char (*) [8])"nPixels",&vb
                            );
                }
                rng.state = 0x853c49e6748fea9b;
                rng.inc = 0xda3e39cb94b95bdb;
                local_478._0_8_ = fopen("m.csv","w");
                for (local_478._8_4_ = 0; (int)local_478._8_4_ < nInstances;
                    local_478._8_4_ = local_478._8_4_ + 1) {
                  for (iVar8 = 0; iVar8 != 3; iVar8 = iVar8 + 1) {
                    iVar9 = width;
                    for (iVar11 = -width; iVar11 <= iVar9; iVar11 = iVar11 + 1) {
                      iVar13 = -iVar9;
                      for (; iVar13 <= iVar9; iVar13 = iVar13 + 1) {
                        auVar16._0_4_ = pbrt::RNG::Uniform<float>(&rng);
                        auVar16._4_60_ = extraout_var;
                        auVar2 = vfmadd132ss_fma(auVar16._0_16_,SUB6416(ZEXT464(0xbf800000),0),
                                                 ZEXT416(0x40000000));
                        FVar15 = pbrt::ErfInv(auVar2._0_4_);
                        auVar2 = vfmadd213ss_fma(ZEXT416((uint)FVar15),
                                                 SUB6416(ZEXT464(0x3e10d0c3),0),ZEXT416(0));
                        iVar9 = -width;
                        local_4a0 = auVar2._0_4_;
                        iVar4 = pixel._M_elems[0];
                        iVar5 = pixel._M_elems[1];
                        uVar1 = 0x20;
                        if (iVar13 != iVar9 && SBORROW4(iVar13,iVar9) == iVar13 + width < 0) {
                          uVar1 = 0x2c;
                        }
                        if (iVar11 != iVar9 && SBORROW4(iVar11,iVar9) == iVar11 + width < 0) {
                          uVar1 = 0x2c;
                        }
                        pbrt::WrapMode2D::WrapMode2D(&local_460,Clamp);
                        p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar4 + iVar11;
                        p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar5 + iVar13;
                        FVar15 = pbrt::Image::GetChannel(&image,p_00,iVar8,local_460);
                        fprintf((FILE *)local_478._0_8_,"%c%f ",(double)(FVar15 + local_4a0),uVar1);
                        iVar9 = width;
                      }
                    }
                    fputc(10,(FILE *)local_478._0_8_);
                  }
                }
                fclose((FILE *)local_478._0_8_);
                __stream = fopen("b.csv","w");
                for (local_4a0 = 0.0; (int)local_4a0 < nInstances;
                    local_4a0 = (float)((int)local_4a0 + 1)) {
                  for (iVar8 = 0; p._M_elems = pixel._M_elems, iVar8 != 3; iVar8 = iVar8 + 1) {
                    pbrt::WrapMode2D::WrapMode2D(&local_468,Clamp);
                    FVar15 = pbrt::Image::GetChannel(&image,(Point2i)p._M_elems,iVar8,local_468);
                    fprintf(__stream,"%f\n",(double)FVar15);
                  }
                }
                fclose(__stream);
                bVar6 = true;
              }
              pbrt::Image::~Image(&image);
              pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                        (&rgbDesc.offset);
              pbrt::ImageAndMetadata::~ImageAndMetadata(&imRead);
              std::__cxx11::string::~string((string *)&filename);
              if (bVar6) {
                pbrt::CleanupPBRT();
                return 0;
              }
            }
            else {
              fprintf(_stderr,"imgtool: unknown command \"%s\"",__s1);
              help();
              pbrt::CleanupPBRT();
            }
            return 1;
          }
          makesky((int)pcVar12,ppcVar3 + 2);
        }
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    InitPBRT({});

    if (argc < 2) {
        help();
        return 0;
    }

    if (strcmp(argv[1], "average") == 0)
        return average(argc - 2, argv + 2);
    else if (strcmp(argv[1], "assemble") == 0)
        return assemble(argc - 2, argv + 2);
    else if (strcmp(argv[1], "bloom") == 0)
        return bloom(argc - 2, argv + 2);
    else if (strcmp(argv[1], "cat") == 0)
        return cat(argc - 2, argv + 2);
    else if (strcmp(argv[1], "convert") == 0)
        return convert(argc - 2, argv + 2);
    else if (strcmp(argv[1], "diff") == 0)
        return diff(argc - 2, argv + 2);
    else if (strcmp(argv[1], "denoise") == 0)
        return denoise(argc - 2, argv + 2);
#ifdef PBRT_BUILD_GPU_RENDERER
    else if (strcmp(argv[1], "denoise-optix") == 0)
        return denoise_optix(argc - 2, argv + 2);
#endif  // PBRT_BUILD_GPU_RENDERER
    else if (strcmp(argv[1], "error") == 0)
        return error(argc - 2, argv + 2);
    else if (strcmp(argv[1], "falsecolor") == 0)
        return falsecolor(argc - 2, argv + 2);
    else if (strcmp(argv[1], "help") == 0 || strcmp(argv[1], "-help") == 0 ||
             strcmp(argv[1], "--help") == 0 || strcmp(argv[1], "-h") == 0)
        return help(argc - 2, argv + 2);
    else if (strcmp(argv[1], "info") == 0)
        return info(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makeenv") == 0)
        return makeenv(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makeemitters") == 0)
        return makeemitters(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makesky") == 0)
        return makesky(argc - 2, argv + 2);
    else if (strcmp(argv[1], "whitebalance") == 0)
        return whitebalance(argc - 2, argv + 2);
    else if (strcmp(argv[1], "noisybit") == 0) {
        // hack for brute force comptuation of ideal filter weights.

        argv += 2;
        std::string filename;
        std::array<int, 2> pixel = {0, 0};
        int width = 10;
        Float sigma = 1;
        int nInstances = 100;

        while (*argv != nullptr) {
            auto onError = [](const std::string &err) {
                usage("%s", err.c_str());
                exit(1);
            };
            if (ParseArg(&argv, "pixel", pstd::MakeSpan(pixel), onError) ||
                ParseArg(&argv, "width", &width, onError) ||
                ParseArg(&argv, "sigma", &sigma, onError) ||
                ParseArg(&argv, "n", &nInstances, onError))
                ;  // yaay
            else if (filename.empty()) {
                filename = *argv;
                ++argv;
            } else
                onError(StringPrintf("unexpected argument \"%s\"", *argv));
        }
        CHECK(!filename.empty());

        ImageAndMetadata imRead = Image::Read(filename);
        ImageChannelDesc rgbDesc = imRead.image.GetChannelDesc({"R", "G", "B"});
        CHECK((bool)rgbDesc);
        Image image = imRead.image.SelectChannels(rgbDesc);

        if (pixel[0] - width < 0 || pixel[0] + width >= image.Resolution().x ||
            pixel[0] - width < 0 || pixel[0] + width >= image.Resolution().y) {
            fprintf(stderr,
                    "%s: pixel (%d, %d) with width %d doesn't work with "
                    "resolution (%d, %d).\n",
                    filename.c_str(), pixel[0], pixel[0], width, image.Resolution().x,
                    image.Resolution().y);
            return 1;
        }

        int nPixels = Sqr(2 * width + 1);
        CHECK_GE(3 * nInstances, nPixels);  // want to be overconstrained

        RNG rng;
        //
        FILE *f = fopen("m.csv", "w");
        for (int i = 0; i < nInstances; ++i)
            for (int c = 0; c < 3; ++c) {
                for (int dx = -width; dx <= width; ++dx)
                    for (int dy = -width; dy <= width; ++dy) {
                        // Float noise = .1 * std::exp(-rng.Uniform<Float>() *
                        // 3); if (rng.Uniform<Float>() < .5) noise = -noise;
                        Float noise = SampleNormal(rng.Uniform<Float>(), 0., .1);
                        // TODO: use sigma, make this controllable, etc.
                        fprintf(f, "%c%f ", (dx > -width || dy > -width) ? ',' : ' ',
                                image.GetChannel({pixel[0] + dx, pixel[1] + dy}, c)
                                    // *  (.95 + .05 * rng.Uniform<Float>())
                                    + noise);
                    }
                fprintf(f, "\n");
            }
        fclose(f);

        // what it should equal
        f = fopen("b.csv", "w");
        for (int i = 0; i < nInstances; ++i)
            for (int c = 0; c < 3; ++c)
                fprintf(f, "%f\n", image.GetChannel({pixel[0], pixel[1]}, c));
        fclose(f);

        /*
          LeastSquares[Import["m.csv"], Import["b.csv"]]
          ArrayPlot[ArrayReshape[ %, {21, 21}], ColorFunction -> Function[a,
          GrayLevel[4 a]]]
        */
    } else {
        fprintf(stderr, "imgtool: unknown command \"%s\"", argv[1]);
        help();
        CleanupPBRT();
        return 1;
    }